

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::
ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
::push_back(ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  
  reserve(this,this->numActive + 1);
  pbVar2 = this->items + this->numActive;
  pbVar5 = this->items + this->numActive;
  (pbVar5->_M_dataplus)._M_p = (pointer)&pbVar5->field_2;
  pcVar3 = (item->_M_dataplus)._M_p;
  paVar1 = &item->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&item->field_2 + 8);
    (pbVar5->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&pbVar5->field_2 + 8) = uVar4;
  }
  else {
    (pbVar2->_M_dataplus)._M_p = pcVar3;
    (pbVar2->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  pbVar2->_M_string_length = item->_M_string_length;
  (item->_M_dataplus)._M_p = (pointer)paVar1;
  item->_M_string_length = 0;
  (item->field_2)._M_local_buf[0] = '\0';
  this->numActive = this->numActive + 1;
  return;
}

Assistant:

void push_back (Item&& item)                            { reserve (numActive + 1); new (items + numActive) Item (std::move (item)); ++numActive; }